

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

_Bool textui_get_item(object **choice,char *pmt,char *str,cmd_code cmd,item_tester tester,
                     wchar_t mode)

{
  uint32_t *puVar1;
  ushort uVar2;
  player_upkeep *ppVar3;
  bool bVar4;
  uint uVar5;
  wchar_t wVar6;
  player *ppVar7;
  cmd_code lookup_cmd;
  size_t sVar8;
  _Bool _Var9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  object *poVar13;
  size_t sVar14;
  menu_conflict *menu;
  void *pvVar15;
  olist_detail_t oVar16;
  wchar_t wVar17;
  int iVar18;
  undefined4 extraout_EDX;
  long lVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  wchar_t wVar24;
  object **list;
  char *pcVar25;
  uint uVar26;
  byte bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  ui_event uVar30;
  char tmp_val [75];
  char out_val [75];
  byte local_108;
  menu_iter local_d8 [2];
  char local_88 [88];
  
  uVar2 = z_info->floor_size;
  uVar26 = (uint)z_info->pack_size + (uint)uVar2 + (uint)z_info->quiver_size;
  floor_list = (object **)mem_zalloc((ulong)((uint)uVar2 * 8));
  throwing_list = (object **)mem_zalloc((ulong)(uVar26 * 8));
  allow_all = str == (char *)0x0;
  oVar16 = OLIST_FAIL;
  if ((mode & 0x40U) == 0) {
    oVar16 = OLIST_WEIGHT;
  }
  olist_mode = (uint)mode >> 2 & OLIST_RECHARGE |
               (uint)mode >> 6 & OLIST_QUIVER |
               (uint)mode >> 2 & OLIST_SEMPTY | (uint)mode >> 1 & OLIST_PRICE | oVar16;
  item_mode = mode;
  item_cmd = cmd;
  tester_m = tester;
  prompt = pmt;
  event_signal(EVENT_MESSAGE_FLUSH);
  i1 = L'\0';
  i2 = (uint)z_info->pack_size + L'\xffffffff';
  if ((mode & 2U) == 0) {
    i2 = L'\xffffffff';
  }
  wVar24 = L'\xffffffff';
  if (L'\xffffffff' < i2) {
    do {
      _Var9 = object_test(tester,player->upkeep->inven[i1]);
      wVar24 = i2;
      if (_Var9) break;
      wVar17 = i1 + L'\x01';
      bVar4 = i1 < i2;
      i1 = wVar17;
    } while (bVar4);
  }
  if (i1 <= wVar24) {
    do {
      _Var9 = object_test(tester,player->upkeep->inven[wVar24]);
      wVar24 = i2;
      if (_Var9) break;
      wVar24 = i2 + L'\xffffffff';
      bVar4 = i1 < i2;
      i2 = wVar24;
    } while (bVar4);
  }
  bVar27 = 1;
  if ((wVar24 < i1) && (allow_all == false)) {
    if ((item_mode & 2U) != 0) {
      item_mode = item_mode + L'\xfffffffe';
    }
    bVar27 = 0;
  }
  e1 = L'\0';
  e2 = (uint)(player->body).count + L'\xffffffff';
  if ((mode & 1U) == 0) {
    e2 = L'\xffffffff';
  }
  wVar24 = e2;
  if (cmd != CMD_NULL || tester != (item_tester)0x0) {
    wVar24 = L'\xffffffff';
    if (L'\xffffffff' < e2) {
      do {
        poVar13 = slot_object(player,e1);
        _Var9 = object_test(tester,poVar13);
        wVar24 = e2;
        if (_Var9) break;
        wVar17 = e1 + L'\x01';
        bVar4 = e1 < e2;
        e1 = wVar17;
      } while (bVar4);
    }
    if (e1 <= wVar24) {
      do {
        poVar13 = slot_object(player,wVar24);
        _Var9 = object_test(tester,poVar13);
        wVar24 = e2;
        if (_Var9) break;
        wVar24 = e2 + L'\xffffffff';
        bVar4 = e1 < e2;
        e2 = wVar24;
      } while (bVar4);
    }
  }
  bVar10 = 1;
  if ((wVar24 < e1) && (allow_all == false)) {
    if ((item_mode & 1U) != 0) {
      item_mode = item_mode + L'\xffffffff';
    }
    bVar10 = 0;
  }
  q1 = L'\0';
  q2 = (uint)z_info->quiver_size + L'\xffffffff';
  if ((mode & 8U) == 0) {
    q2 = L'\xffffffff';
  }
  wVar24 = L'\xffffffff';
  if (L'\xffffffff' < q2) {
    do {
      _Var9 = object_test(tester,player->upkeep->quiver[q1]);
      wVar24 = q2;
      if (_Var9) break;
      wVar17 = q1 + L'\x01';
      bVar4 = q1 < q2;
      q1 = wVar17;
    } while (bVar4);
  }
  if (q1 <= wVar24) {
    do {
      _Var9 = object_test(tester,player->upkeep->quiver[wVar24]);
      wVar24 = q2;
      if (_Var9) break;
      wVar24 = q2 + L'\xffffffff';
      bVar4 = q1 < q2;
      q2 = wVar24;
    } while (bVar4);
  }
  bVar20 = 1;
  if ((wVar24 < q1) && (allow_all == false)) {
    if ((item_mode & 8U) != 0) {
      item_mode = item_mode + L'\xfffffff8';
    }
    bVar20 = 0;
  }
  wVar24 = scan_floor(floor_list,(uint)uVar2,player,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
  f1 = L'\0';
  local_108 = (byte)mode;
  f2 = L'\xffffffff';
  if ((mode & 4U) != 0) {
    f2 = wVar24 + L'\xffffffff';
  }
  if (L'\xffffffff' < f2) {
    do {
      _Var9 = object_test(tester,floor_list[f1]);
      if (_Var9) break;
      wVar24 = f1 + L'\x01';
      bVar4 = f1 < f2;
      f1 = wVar24;
    } while (bVar4);
  }
  if (f1 <= f2) {
    do {
      _Var9 = object_test(tester,floor_list[f2]);
      if (_Var9) break;
      wVar24 = f2 + L'\xffffffff';
      bVar4 = f1 < f2;
      f2 = wVar24;
    } while (bVar4);
  }
  bVar23 = 1;
  if ((f2 < f1) && (allow_all == false)) {
    if ((item_mode & 4U) != 0) {
      item_mode = item_mode + L'\xfffffffc';
    }
    bVar23 = 0;
  }
  throwing_num = scan_items(throwing_list,(ulong)uVar26,player,L'\x0e',obj_is_throwing);
  if ((byte)(bVar27 | bVar10 | bVar20 | bVar23) != 1) {
    if (str != (char *)0x0) {
      msg("%s");
    }
    *choice = (object *)0x0;
    goto LAB_001f998a;
  }
  if ((((uint)mode >> 0xb & 1) == 0) || (wVar24 = L'ࠀ', throwing_num == L'\0')) {
    wVar17 = player->upkeep->command_wrk;
    wVar24 = L'\x01';
    if (((bVar10 & wVar17 == L'\x01') == 0) && (wVar24 = L'\x02', (bVar27 & wVar17 == L'\x02') == 0)
       ) {
      if ((bVar20 & wVar17 == L'\b') == 0) {
        wVar24 = L'\x04';
        if ((bVar23 & wVar17 == L'\x04') == 0) {
          if ((cmd != CMD_USE & (byte)((uint)mode >> 9) & bVar20) != 0) goto LAB_001f8d54;
          wVar24 = L'\x02';
          if ((((local_108 >> 1 & bVar27) == 0) && (wVar24 = L'\x01', (local_108 & bVar10) == 0)) &&
             (wVar24 = L'\b', (local_108 >> 3 & bVar20) == 0)) {
            wVar24 = L'\x02';
            if ((mode & 4U) != 0) {
              wVar24 = (uint)bVar23 * 2 + L'\x02';
            }
          }
        }
      }
      else {
LAB_001f8d54:
        wVar24 = L'\b';
      }
    }
  }
  player->upkeep->command_wrk = wVar24;
  bVar4 = false;
  do {
    lVar19 = 0;
    iVar11 = 0;
    iVar18 = 0;
    do {
      if (angband_term[lVar19] != (term *)0x0) {
        iVar18 = iVar18 + (window_flag[lVar19] & 1);
        iVar11 = iVar11 + (uint)((window_flag[lVar19] >> 1 & 1) != 0);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 8);
    if ((iVar18 != 0) != (iVar11 != 0)) {
      wVar24 = player->upkeep->command_wrk;
      if (wVar24 == L'\x02') {
        bVar28 = iVar18 == 0;
        iVar18 = iVar11;
        if (bVar28) {
joined_r0x001f8e3b:
          if ((iVar18 == 0) || (!bVar4)) goto LAB_001f8e69;
        }
        else {
joined_r0x001f8e37:
          if (bVar4) goto joined_r0x001f8e3b;
        }
        toggle_inven_equip();
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else {
        if (wVar24 == L'\x01') {
          if (iVar11 != 0) goto joined_r0x001f8e37;
          goto joined_r0x001f8e3b;
        }
        if (bVar4) {
          toggle_inven_equip();
          bVar4 = false;
        }
      }
    }
LAB_001f8e69:
    ppVar7 = player;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x60000;
    redraw_stuff(ppVar7);
    screen_save();
    wipe_obj_list();
    ppVar3 = player->upkeep;
    switch(ppVar3->command_wrk) {
    case L'\x01':
      list = (object **)0x0;
      wVar24 = e2;
      break;
    case L'\x02':
      list = ppVar3->inven;
      wVar24 = i2;
      break;
    case L'\x03':
    case L'\x05':
    case L'\x06':
    case L'\a':
      goto switchD_001f8eac_caseD_3;
    case L'\x04':
      list = floor_list;
      wVar24 = f2;
      break;
    case L'\b':
      list = ppVar3->quiver;
      wVar24 = q2;
      break;
    default:
      list = throwing_list;
      wVar24 = throwing_num;
      if (ppVar3->command_wrk == L'ࠀ') break;
      goto switchD_001f8eac_caseD_3;
    }
    build_obj_list(wVar24,list,tester_m,olist_mode);
switchD_001f8eac_caseD_3:
    _Var9 = allow_all;
    wVar17 = item_mode;
    bVar28 = f1 <= f2;
    wVar24 = player->upkeep->command_wrk;
    if (wVar24 < L'\b') {
      if (wVar24 == L'\x01') {
        strnfmt(local_88,0x4b,"Equip:");
        if (e1 <= e2) {
          strnfmt((char *)local_d8,0x4b," %c-%c,",
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e1],
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e2]);
LAB_001f9138:
          my_strcat(local_88,(char *)local_d8,0x4b);
        }
LAB_001f9148:
        if ((wVar17 & 2U) != 0) {
          pcVar25 = " / for Inven,";
LAB_001f915c:
          my_strcat(local_88,pcVar25,0x4b);
        }
LAB_001f9161:
        if ((wVar17 & 8U) != 0) {
          pcVar25 = " | for Quiver,";
LAB_001f91f0:
          my_strcat(local_88,pcVar25,0x4b);
        }
        goto LAB_001f91f5;
      }
      if (wVar24 == L'\x02') {
        strnfmt(local_88,0x4b,"Inven:");
        if (i1 <= i2) {
          strnfmt((char *)local_d8,0x4b," %c-%c,",
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i1],
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i2]);
          my_strcat(local_88,(char *)local_d8,0x4b);
        }
        if ((wVar17 & 1U) != 0) {
          pcVar25 = " / for Equip,";
          goto LAB_001f915c;
        }
        goto LAB_001f9161;
      }
LAB_001f903a:
      strnfmt(local_88,0x4b,"Floor:");
      if (f1 <= f2) {
        strnfmt((char *)local_d8,0x4b," %c-%c,",
                (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f1],
                (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f2]);
        my_strcat(local_88,(char *)local_d8,0x4b);
      }
      if ((wVar17 & 3U) != 0) {
        pcVar25 = " / for Inven,";
        if ((wVar17 & 2U) == 0) {
          pcVar25 = " / for Equip,";
        }
        my_strcat(local_88,pcVar25,0x4b);
      }
      pcVar25 = " | for Quiver,";
      if ((wVar17 & 8U) != 0) goto LAB_001f920e;
    }
    else {
      if (wVar24 != L'\b') {
        if (wVar24 != L'ࠀ') goto LAB_001f903a;
        strnfmt(local_88,0x4b,"Throwing items:");
        if ((long)throwing_num != 0) {
          strnfmt((char *)local_d8,0x4b," a-%c,",
                  (ulong)(uint)(int)(char)(&DAT_002404cf)[throwing_num]);
          goto LAB_001f9138;
        }
        goto LAB_001f9148;
      }
      strnfmt(local_88,0x4b,"Quiver:");
      if (q1 <= q2) {
        strnfmt((char *)local_d8,0x4b," %d-%d,");
        my_strcat(local_88,(char *)local_d8,0x4b);
      }
      if ((wVar17 & 3U) != 0) {
        pcVar25 = " / for Inven,";
        if ((wVar17 & 2U) == 0) {
          pcVar25 = " / for Equip,";
        }
        goto LAB_001f91f0;
      }
LAB_001f91f5:
      pcVar25 = " - for floor,";
      if (bVar28 || (_Var9 & 1U) != 0) {
LAB_001f920e:
        my_strcat(local_88,pcVar25,0x4b);
      }
    }
    my_strcat(local_88," ESC",0x4b);
    strnfmt(header,0x50,"(%s)",local_88);
    if (pmt == (char *)0x0) {
      wVar24 = L'\r';
    }
    else {
      prt(pmt,L'\0',L'\0');
      sVar14 = strlen(pmt);
      prt(header,L'\0',(int)sVar14 + L'\x01');
      sVar14 = strlen(pmt);
      iVar18 = (int)sVar14;
      if (sVar14 < 0x10) {
        iVar18 = 0xf;
      }
      wVar24 = iVar18 + L'\xfffffffe';
    }
    newmenu = '\0';
    local_d8[0].resize = (_func_void_menu_ptr_conflict *)0x0;
    local_d8[0].display_row = get_item_display;
    local_d8[0].row_handler = get_item_action;
    local_d8[0].get_tag = get_item_tag;
    local_d8[0].valid_row = get_item_validity;
    menu = menu_new(MN_SKIN_OBJECT,local_d8);
    menu_setpriv(menu,num_obj,items);
    pcVar25 = "0123456789";
    if (player->upkeep->command_wrk != L'\b') {
      pcVar25 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    }
    menu->selections = pcVar25;
    menu->switch_keys = "/|-";
    menu->context_hook = use_context_menu_list_switcher;
    menu->flags = 0x44;
    menu->browse_hook = item_menu_browser;
    pcVar25 = (char *)mem_zalloc(10);
    menu->inscriptions = pcVar25;
    lVar19 = 0;
    do {
      lookup_cmd = item_cmd;
      bVar27 = (byte)lVar19 | 0x30;
      _Var9 = (player->opts).opt[1];
      if (((item_mode & 0x200U) == 0) ||
         (poVar13 = player->upkeep->quiver[(ulong)bVar27 - 0x30], poVar13 == (object *)0x0)) {
        if (L'\0' < num_obj) {
          lVar21 = 0;
          do {
            poVar13 = items[lVar21].object;
            if ((poVar13 != (object *)0x0) && (poVar13->note != 0)) {
              pcVar25 = quark_str(poVar13->note);
              for (pcVar25 = strchr(pcVar25,0x40); pcVar25 != (char *)0x0;
                  pcVar25 = strchr(pcVar25 + 1,0x40)) {
                if (pcVar25[1] == bVar27) goto LAB_001f943a;
                bVar10 = cmd_lookup_key_unktrl(lookup_cmd,(uint)_Var9);
                if (((int)pcVar25[1] == (uint)bVar10) && (pcVar25[2] == bVar27)) goto LAB_001f943a;
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < num_obj);
        }
      }
      else {
LAB_001f943a:
        if (0 < (long)num_obj) {
          lVar21 = 0;
          do {
            if (*(object **)(items[0].o_name + lVar21 + -8) == poVar13) {
              pvVar15 = menu_priv(menu);
              menu->inscriptions[lVar19] = *(char *)((long)pvVar15 + lVar21 + 0xf8);
              break;
            }
            lVar21 = lVar21 + 0x100;
          } while ((long)num_obj * 0x100 != lVar21);
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    selection = (object *)0x0;
    set_obj_names(false,player);
    if ((((mode & 2U) != 0) && (*player->upkeep->quiver != (object *)0x0)) && (max_len < 0x19)) {
      max_len = 0x18;
    }
    auVar29._0_4_ = -(uint)((olist_mode & (OLIST_FAIL|OLIST_PRICE|OLIST_WEIGHT)) == OLIST_NONE);
    auVar29._4_4_ = -(uint)((olist_mode & OLIST_FAIL) == OLIST_NONE);
    auVar29._8_4_ = -(uint)((olist_mode & OLIST_PRICE) == OLIST_NONE);
    auVar29._12_4_ = -(uint)((olist_mode & OLIST_WEIGHT) == OLIST_NONE);
    uVar26 = movmskps(extraout_EDX,auVar29);
    bVar28 = (uVar26 & 8) == 0;
    wVar17 = ex_width + L'\t';
    if (!bVar28) {
      wVar17 = ex_width;
    }
    uVar5 = (uint)bVar28 * 9 + 9;
    wVar6 = wVar17 + L'\t';
    if ((uVar26 & 4) != 0) {
      uVar5 = (uint)bVar28 * 9;
      wVar6 = wVar17;
    }
    bVar28 = (uVar26 & 2) != 0;
    wVar17 = wVar6 + L'\n';
    if (bVar28) {
      wVar17 = wVar6;
    }
    uVar12 = uVar5 + 10;
    if (bVar28) {
      uVar12 = uVar5;
    }
    if ((uVar26 & 1) == 0) {
      ex_width = wVar17;
    }
    area.page_rows = menu->count;
    area.row = L'\x01';
    area.col = (Term->wid - wVar17) + ~(wchar_t)max_len;
    if (wVar24 <= area.col) {
      area.col = wVar24;
    }
    if (area.col < L'\x04') {
      area.col = L'\0';
    }
    ex_offset = (~wVar17 + Term->wid) - area.col;
    if (max_len <= (ulong)(long)ex_offset) {
      ex_offset = (wchar_t)max_len;
    }
    do {
      sVar14 = strlen(header);
      if ((long)ex_width + max_len + (ulong)uVar12 <= sVar14) break;
      my_strcat(header," ",0x50);
      sVar14 = strlen(header);
    } while (sVar14 < 0x4f);
    sVar8 = max_len;
    sVar14 = strlen(header);
    if (sVar14 < sVar8) {
      sVar14 = sVar8;
    }
    area.width = (wchar_t)sVar14;
    wVar24 = area.row;
    if (L'\0' < area.page_rows) {
      do {
        wVar17 = area.col;
        if (area.col < L'\x02') {
          wVar17 = L'\x01';
        }
        prt("",wVar24,wVar17 + L'\xffffffff');
        wVar24 = wVar24 + L'\x01';
      } while (wVar24 < area.page_rows + area.row);
    }
    menu_layout(menu,(region_conflict *)&area);
    uVar30 = menu_select(menu,0,true);
    mem_free(menu->inscriptions);
    mem_free(menu);
    if ((uVar30.type != EVT_SWITCH) || (newmenu != '\0')) goto LAB_001f9927;
    uVar22 = (ulong)uVar30.mouse & 0xffffffff00000000;
    wVar24 = player->upkeep->command_wrk;
    switch(wVar24) {
    case L'\x01':
      if (uVar22 == 0x8100000000) {
        wVar24 = L'\x04';
        if ((f2 < f1) && (wVar24 = L'\b', q2 < q1)) {
LAB_001f98cf:
          wVar24 = L'\x02';
          if (i2 < i1) break;
        }
      }
      else {
        wVar24 = L'\x02';
        if ((i2 < i1) && (wVar24 = L'\b', q2 < q1)) {
LAB_001f990a:
          wVar24 = L'\x04';
          if (f2 < f1) break;
        }
      }
      goto LAB_001f991d;
    case L'\x02':
      if (uVar22 == 0x8100000000) {
        wVar24 = L'\x01';
        if ((e1 <= e2) || (wVar24 = L'\x04', f1 <= f2)) goto LAB_001f991d;
LAB_001f984a:
        wVar24 = L'\b';
        if (q1 <= q2) goto LAB_001f991d;
      }
      else {
        wVar24 = L'\b';
        if ((q1 <= q2) || (wVar24 = L'\x04', f1 <= f2)) goto LAB_001f991d;
LAB_001f9894:
        wVar24 = L'\x01';
        if (e1 <= e2) goto LAB_001f991d;
      }
      break;
    case L'\x03':
    case L'\x05':
    case L'\x06':
    case L'\a':
      break;
    case L'\x04':
switchD_001f96fa_caseD_4:
      if (uVar22 == 0x8100000000) {
        wVar24 = L'\b';
        if ((q2 < q1) && (wVar24 = L'\x02', i2 < i1)) goto LAB_001f9894;
      }
      else {
        wVar24 = L'\x01';
        if ((e2 < e1) && (wVar24 = L'\x02', i2 < i1)) goto LAB_001f984a;
      }
      goto LAB_001f991d;
    case L'\b':
      if (uVar22 == 0x8100000000) {
        wVar24 = L'\x02';
        if ((i2 < i1) && (wVar24 = L'\x01', e2 < e1)) goto LAB_001f990a;
      }
      else {
        wVar24 = L'\x04';
        if ((f2 < f1) && (wVar24 = L'\x01', e2 < e1)) goto LAB_001f98cf;
      }
LAB_001f991d:
      player->upkeep->command_wrk = wVar24;
      break;
    default:
      if (wVar24 == L'ࠀ') goto switchD_001f96fa_caseD_4;
    }
    newmenu = '\x01';
LAB_001f9927:
    *choice = selection;
    screen_load();
    ppVar7 = player;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x60000;
    redraw_stuff(ppVar7);
    prt("",L'\0',L'\0');
  } while ((*choice == (object *)0x0) && (newmenu != '\0'));
  if (bVar4) {
    toggle_inven_equip();
  }
LAB_001f998a:
  player->upkeep->command_wrk = L'\0';
  mem_free(throwing_list);
  mem_free(floor_list);
  return *choice != (object *)0x0;
}

Assistant:

bool textui_get_item(struct object **choice, const char *pmt, const char *str,
					 cmd_code cmd, item_tester tester, int mode)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);
	bool quiver_tags = ((mode & QUIVER_TAGS) ? true : false);
	bool show_throwing = ((mode & SHOW_THROWING) ? true : false);

	bool allow_inven = false;
	bool allow_equip = false;
	bool allow_quiver = false;
	bool allow_floor = false;

	bool toggle = false;

	int floor_max = z_info->floor_size;
	int floor_num;

	int throwing_max = z_info->pack_size + z_info->quiver_size +
		z_info->floor_size;

	floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	throwing_list = mem_zalloc(throwing_max * sizeof(*throwing_list));
	olist_mode = 0;
	item_mode = mode;
	item_cmd = cmd;
	tester_m = tester;
	prompt = pmt;
	allow_all = str ? false : true;

	/* Object list display modes */
	if (mode & SHOW_FAIL)
		olist_mode |= OLIST_FAIL;
	else
		olist_mode |= OLIST_WEIGHT;

	if (mode & SHOW_PRICES)
		olist_mode |= OLIST_PRICE;

	if (mode & SHOW_EMPTY)
		olist_mode |= OLIST_SEMPTY;

	if (mode & SHOW_QUIVER)
		olist_mode |= OLIST_QUIVER;

	if (mode & SHOW_RECHARGE)
		olist_mode |= OLIST_RECHARGE;

	/* Paranoia XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Full inventory */
	i1 = 0;
	i2 = z_info->pack_size - 1;

	/* Forbid inventory */
	if (!use_inven) i2 = -1;

	/* Restrict inventory indexes */
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i1])))
		i1++;
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i2])))
		i2--;

	/* Accept inventory */
	if ((i1 <= i2) || allow_all)
		allow_inven = true;
	else if (item_mode & USE_INVEN)
		item_mode -= USE_INVEN;

	/* Full equipment */
	e1 = 0;
	e2 = player->body.count - 1;

	/* Forbid equipment */
	if (!use_equip) e2 = -1;

	/* Restrict equipment indexes unless starting with no command */
	if ((cmd != CMD_NULL) || (tester != NULL)) {
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e1))))
			e1++;
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e2))))
			e2--;
	}

	/* Accept equipment */
	if ((e1 <= e2) || allow_all)
		allow_equip = true;
	else if (item_mode & USE_EQUIP)
		item_mode -= USE_EQUIP;

	/* Restrict quiver indexes */
	q1 = 0;
	q2 = z_info->quiver_size - 1;

	/* Forbid quiver */
	if (!use_quiver) q2 = -1;

	/* Restrict quiver indexes */
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q1])))
		q1++;
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q2])))
		q2--;

	/* Accept quiver */
	if ((q1 <= q2) || allow_all)
		allow_quiver = true;
	else if (item_mode & USE_QUIVER)
		item_mode -= USE_QUIVER;

	/* Scan all non-gold objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

	/* Full floor */
	f1 = 0;
	f2 = floor_num - 1;

	/* Forbid floor */
	if (!use_floor) f2 = -1;

	/* Restrict floor indexes */
	while ((f1 <= f2) && (!object_test(tester, floor_list[f1]))) f1++;
	while ((f1 <= f2) && (!object_test(tester, floor_list[f2]))) f2--;

	/* Accept floor */
	if ((f1 <= f2) || allow_all)
		allow_floor = true;
	else if (item_mode & USE_FLOOR)
		item_mode -= USE_FLOOR;

	/* Scan all throwing objects in reach */
	throwing_num = scan_items(throwing_list, throwing_max, player,
		USE_INVEN | USE_QUIVER | USE_FLOOR, obj_is_throwing);

	/* Require at least one legal choice */
	if (allow_inven || allow_equip || allow_quiver || allow_floor) {
		/* Use throwing menu if at all possible */
		if (show_throwing && throwing_num) {
			player->upkeep->command_wrk = SHOW_THROWING;

			/* Start where requested if possible */
		} else if ((player->upkeep->command_wrk == USE_EQUIP) && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if ((player->upkeep->command_wrk == USE_INVEN) && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if ((player->upkeep->command_wrk == USE_QUIVER) && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if ((player->upkeep->command_wrk == USE_FLOOR) && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If we are obviously using the quiver then start on quiver */
		else if (quiver_tags && allow_quiver && (cmd != CMD_USE))
			player->upkeep->command_wrk = USE_QUIVER;

		/* Otherwise choose whatever is allowed */
		else if (use_inven && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if (use_equip && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if (use_quiver && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if (use_floor && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If nothing to choose, use (empty) inventory */
		else
			player->upkeep->command_wrk = USE_INVEN;

		while (true) {
			int j;
			int ni = 0;
			int ne = 0;

			/* If inven or equip is on the main screen, and only one of them
			 * is slated for a subwindow, we should show the opposite there */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				/* Unused */
				if (!angband_term[j]) continue;

				/* Count windows displaying inven */
				if (window_flag[j] & (PW_INVEN)) ni++;

				/* Count windows displaying equip */
				if (window_flag[j] & (PW_EQUIP)) ne++;
			}

			/* Are we in the situation where toggling makes sense? */
			if ((ni && !ne) || (!ni && ne)) {
				if (player->upkeep->command_wrk == USE_EQUIP) {
					if ((ne && !toggle) || (ni && toggle)) {
						/* Main screen is equipment, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else if (player->upkeep->command_wrk == USE_INVEN) {
					if ((ni && !toggle) || (ne && toggle)) {
						/* Main screen is inventory, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else {
					/* Quiver or floor, go back to the original */
					if (toggle) {
						toggle_inven_equip();
						toggle = !toggle;
					}
				}
			}

			/* Redraw */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

			/* Redraw windows */
			redraw_stuff(player);

			/* Save screen */
			screen_save();

			/* Build object list */
			wipe_obj_list();
			if (player->upkeep->command_wrk == USE_INVEN)
				build_obj_list(i2, player->upkeep->inven, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_EQUIP)
				build_obj_list(e2, NULL, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_QUIVER)
				build_obj_list(q2, player->upkeep->quiver, tester_m,olist_mode);
			else if (player->upkeep->command_wrk == USE_FLOOR)
				build_obj_list(f2, floor_list, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == SHOW_THROWING)
				build_obj_list(throwing_num, throwing_list, tester_m,
							   olist_mode);

			/* Show the prompt */
			menu_header();
			if (pmt) {
				prt(pmt, 0, 0);
				prt(header, 0, strlen(pmt) + 1);
			}

			/* No menu change request */
			newmenu = false;

			/* Get an item choice */
			*choice = item_menu(cmd, MAX(pmt ? strlen(pmt) : 0, 15), mode);

			/* Fix the screen */
			screen_load();

			/* Update */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
			redraw_stuff(player);

			/* Clear the prompt line */
			prt("", 0, 0);

			/* We have a selection, or are backing out */
			if (*choice || !newmenu) {
				if (toggle) toggle_inven_equip();
				break;
			}
		}
	} else {
		/* Warning if needed */
		if (str) msg("%s", str);
		*choice = NULL;
	}

	/* Clean up */
	player->upkeep->command_wrk = 0;
	mem_free(throwing_list);
	mem_free(floor_list);

	/* Result */
	return (*choice != NULL) ? true : false;
}